

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Uint __thiscall indigox::Molecule::AssignElectrons(Molecule *this)

{
  bool bVar1;
  Uint UVar2;
  ostream *poVar3;
  pointer this_00;
  size_t sVar4;
  Element_p *in_RDI;
  Uint num;
  Atom_p atm;
  iterator __end1;
  iterator __begin1;
  MolAtoms *__range1;
  Atom *in_stack_fffffffffffffee8;
  key_type *in_stack_fffffffffffffef0;
  Uint idx;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  Molecule *this_01;
  iterator in_stack_ffffffffffffff18;
  ElectronOpt *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_b8 [24];
  ElectronOpt *in_stack_ffffffffffffff60;
  _Self local_98 [3];
  string local_80 [32];
  _Self in_stack_ffffffffffffffa0;
  __shared_ptr local_48 [32];
  shared_ptr<indigox::Atom> *local_28;
  __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
  local_20;
  Element_p *local_18;
  Uint local_4;
  
  std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1123d8);
  UVar2 = MolecularGraph::NumConnectedComponents
                    ((MolecularGraph *)in_stack_ffffffffffffffa0._M_node);
  if (UVar2 == 1) {
    local_18 = in_RDI + 4;
    local_20._M_current =
         (shared_ptr<indigox::Atom> *)
         std::
         vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>::
         begin((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                *)in_stack_fffffffffffffee8);
    local_28 = (shared_ptr<indigox::Atom> *)
               std::
               vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ::end((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                      *)in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
                               *)in_stack_fffffffffffffee8), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
      ::operator*(&local_20);
      std::shared_ptr<indigox::Atom>::shared_ptr
                ((shared_ptr<indigox::Atom> *)in_stack_fffffffffffffef0,
                 (shared_ptr<indigox::Atom> *)in_stack_fffffffffffffee8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11249c);
      Atom::GetElement(in_stack_fffffffffffffee8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_48);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x1124ce);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x112546);
        Atom::GetElement(in_stack_fffffffffffffee8);
        std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x112565);
        Element::GetSymbol_abi_cxx11_((Element *)in_stack_fffffffffffffee8);
        in_stack_ffffffffffffff18 =
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        local_98[0]._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffee8);
        bVar1 = std::operator==((_Self *)&stack0xffffffffffffffa0,local_98);
        std::__cxx11::string::~string(local_80);
        std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x1125e6);
        if (bVar1) {
          std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x112600);
          Atom::GetElement(in_stack_fffffffffffffee8);
          poVar3 = operator<<((ostream *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_RDI);
          poVar3 = std::operator<<(poVar3," is not an allowed element for the algorithm.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x11265c);
          local_4 = 0;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        in_stack_ffffffffffffff20 =
             (ElectronOpt *)
             std::operator<<((ostream *)&std::cerr,"Not all atoms have elements assigned.");
        std::ostream::operator<<(in_stack_ffffffffffffff20,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        bVar1 = true;
      }
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x1126f2);
      if (bVar1) {
        return local_4;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Atom>_*,_std::vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>_>
      ::operator++(&local_20);
    }
    this_00 = std::unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>::
              operator->((unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>
                          *)0x11273b);
    this_01 = (Molecule *)local_b8;
    std::shared_ptr<indigox::MolecularGraph>::shared_ptr
              ((shared_ptr<indigox::MolecularGraph> *)this_00,
               (shared_ptr<indigox::MolecularGraph> *)in_stack_fffffffffffffee8);
    idx = (Uint)((ulong)this_00 >> 0x20);
    ElectronOpt::SetMolecularGraph
              (in_stack_ffffffffffffff20,
               (shared_ptr<indigox::MolecularGraph> *)in_stack_ffffffffffffff18._M_node);
    std::shared_ptr<indigox::MolecularGraph>::~shared_ptr
              ((shared_ptr<indigox::MolecularGraph> *)0x112776);
    *(undefined1 *)
     &in_RDI[0x15].super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = 0;
    std::unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>::operator->
              ((unique_ptr<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_> *)
               0x11278e);
    sVar4 = ElectronOpt::Run(in_stack_ffffffffffffff60);
    UVar2 = (Uint)sVar4;
    if (UVar2 != 0) {
      ApplyElectronAssignment(this_01,idx);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Electrons can only be assigned when molecule has only one component.")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    UVar2 = local_4;
  }
  local_4 = UVar2;
  return local_4;
}

Assistant:

Uint Molecule::AssignElectrons() {
  // check is single component (use graph)
  /// @todo
  if (graph_->NumConnectedComponents() != 1) {
    std::cerr << "Electrons can only be assigned when molecule has only one component." << std::endl;
    return 0;
  }
  
  // check all elements valid.
  typedef Options::AssignElectrons opt_;
  for (Atom_p atm : atoms_) {
    if (!atm->GetElement()) {
      std::cerr << "Not all atoms have elements assigned." << std::endl;
      return 0;
    }
    if (opt_::ALLOWED_ELEMENTS.find(atm->GetElement()->GetSymbol())
        == opt_::ALLOWED_ELEMENTS.end()) {
      std::cerr << atm->GetElement() << " is not an allowed element for the algorithm." << std::endl;
      return 0;
    }
  }
  
  // Set the ElectronOpt graph
  elnopt_->SetMolecularGraph(graph_);
  modified_ = false;
  Uint num = (Uint)elnopt_->Run();
  if (num) ApplyElectronAssignment(0);
//  for (auto& tmp : idx_to_atom_) {
//    Atom_p atom = tmp.second.lock();
//    if (atom->GetFormalCharge() != 0) {
//      std::cout << tmp.first << " : " << atom->GetFormalCharge() << std::endl;
//    }
//  }
//  
//  for (auto& tmp : idx_to_bond_) {
//    Bond_p bond = tmp.second.lock();
//    if (bond->GetOrder() != BondOrder::SINGLE_BOND) {
//      uid_t a = bond->GetSourceAtom()->GetIndex();
//      uid_t b = bond->GetTargetAtom()->GetIndex();
//      if (a <= b) std::cout << a << "-" << b << " : " << bond->GetOrder() << std::endl;
//      else std::cout << b << "-" << a << " : " << bond->GetOrder() << std::endl;
//    }
//  }
  return num;
}